

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> * __thiscall
google::protobuf::internal::ThreadSafeArena::PeekCleanupListForTesting
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,ThreadSafeArena *this)

{
  long lVar1;
  SerialArena *pSVar2;
  
  lVar1 = __tls_get_addr(&PTR_001b9f20);
  if (*(uint64_t *)(lVar1 + 8) == this->tag_and_id_) {
    pSVar2 = *(SerialArena **)(lVar1 + 0x10);
  }
  else {
    pSVar2 = GetSerialArenaFallback(this,0x10);
  }
  cleanup::ChunkList::PeekForTesting(__return_storage_ptr__,&pSVar2->cleanup_list_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<void*> ThreadSafeArena::PeekCleanupListForTesting() {
  return GetSerialArena()->PeekCleanupListForTesting();
}